

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O2

void __thiscall
HighsCliqueTable::queryNeighbourhood
          (HighsCliqueTable *this,vector<int,_std::allocator<int>_> *neighbourhoodInds,
          int64_t *numQueries,CliqueVar v,CliqueVar *q,HighsInt N)

{
  __atomic_base<int> _Var1;
  pointer piVar2;
  element_type *peVar3;
  char *pcVar4;
  unique_ptr<PaddedData[]> uVar5;
  HighsSplitDeque *pHVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  uint32_t uVar11;
  long lVar12;
  uint end;
  int i;
  long lVar13;
  HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>
  neighbourhoodData;
  TaskGroup tg;
  anon_class_32_4_8f8caa33 local_70;
  anon_class_24_4_3f80b2e7_for_functor local_50;
  long *local_38;
  
  piVar2 = (neighbourhoodInds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((neighbourhoodInds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_finish != piVar2) {
    (neighbourhoodInds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_finish = piVar2;
  }
  if ((this->numcliquesvar).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[(int)((int)v << 1 | (uint)((int)v < 0))] != 0) {
    if ((long)((long)this->numEntries + (this->sizeTwoCliques).numElements * -2) <
        (long)this->minEntriesForParallelism) {
      iVar8 = 0;
      while (local_70.this = (HighsCliqueTable *)CONCAT44(local_70.this._4_4_,iVar8), iVar8 < N) {
        bVar7 = haveCommonClique(this,numQueries,v,q[iVar8]);
        if (bVar7) {
          std::vector<int,_std::allocator<int>_>::push_back
                    (neighbourhoodInds,(value_type_conflict2 *)&local_70);
        }
        iVar8 = (int)local_70.this + 1;
      }
    }
    else {
      neighbourhoodData.construct_.N = N;
      local_38 = numQueries;
      neighbourhoodData.numThreads = HighsTaskExecutor::getNumWorkerThreads();
      lVar13 = (long)neighbourhoodData.numThreads;
      neighbourhoodData.threadCopies_._M_t.
      super___uniq_ptr_impl<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData,_highs::cache_aligned::Deleter<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData[]>_>
      ._M_t.
      super__Tuple_impl<0UL,_HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData_*,_highs::cache_aligned::Deleter<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData[]>_>
      .
      super__Head_base<0UL,_HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData,_highs::cache_aligned::Deleter<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData[]>,_true,_true>
            )::highs::cache_aligned::alloc(lVar13 << 6);
      lVar12 = 0;
      if (lVar13 < 1) {
        lVar13 = lVar12;
      }
      for (; lVar13 * 0x40 != lVar12; lVar12 = lVar12 + 0x40) {
        *(undefined1 *)
         ((long)neighbourhoodData.threadCopies_._M_t.
                super___uniq_ptr_impl<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData,_highs::cache_aligned::Deleter<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData[]>_>
                ._M_t.
                super__Tuple_impl<0UL,_HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData_*,_highs::cache_aligned::Deleter<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData[]>_>
                .
                super__Head_base<0UL,_HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData_*,_false>
                ._M_head_impl + lVar12) = 0;
      }
      local_70.neighbourhoodData = &neighbourhoodData;
      local_70.this = this;
      local_70.v = v;
      local_70.q = q;
      if (N < 0xb) {
        queryNeighbourhood::anon_class_32_4_8f8caa33::operator()(&local_70,0,N);
      }
      else {
        tg.workerDeque = HighsTaskExecutor::getThisWorkerDeque();
        tg.dequeHead = ((tg.workerDeque)->ownerData).head;
        do {
          pHVar6 = tg.workerDeque;
          end = (uint)N >> 1;
          local_50.grainSize = 10;
          uVar9 = ((tg.workerDeque)->ownerData).head;
          uVar10 = (ulong)uVar9;
          local_50.split = end;
          local_50.end = N;
          local_50.f = &local_70;
          if (uVar10 < 0x2000) {
            uVar11 = (uint32_t)(uVar10 + 1);
            ((tg.workerDeque)->ownerData).head = uVar11;
            ((tg.workerDeque)->taskArray)._M_elems[uVar10].metadata.stealer.
            super___atomic_base<unsigned_long>._M_i = 0;
            *(undefined ***)((tg.workerDeque)->taskArray)._M_elems[uVar10].taskData =
                 &PTR_operator___00433000;
            *(anon_class_32_4_8f8caa33 **)
             (((tg.workerDeque)->taskArray)._M_elems[uVar10].taskData + 0x18) = &local_70;
            pcVar4 = ((tg.workerDeque)->taskArray)._M_elems[uVar10].taskData;
            *(ulong *)(pcVar4 + 8) = CONCAT44(N,end);
            *(ulong *)(pcVar4 + 0x10) = CONCAT44(local_50._12_4_,10);
            if (((tg.workerDeque)->ownerData).allStolenCopy == true) {
              ((tg.workerDeque)->stealerData).ts.super___atomic_base<unsigned_long>._M_i =
                   uVar10 << 0x20 | uVar10 + 1;
              ((tg.workerDeque)->stealerData).allStolen._M_base._M_i = false;
              ((tg.workerDeque)->ownerData).splitCopy = uVar11;
              ((tg.workerDeque)->ownerData).allStolenCopy = false;
              if ((((tg.workerDeque)->splitRequest)._M_base._M_i & 1U) != 0) {
                ((tg.workerDeque)->splitRequest)._M_base._M_i = false;
              }
              peVar3 = ((tg.workerDeque)->ownerData).workerBunk.
                       super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              LOCK();
              _Var1._M_i = (peVar3->haveJobs).super___atomic_base<int>._M_i;
              (peVar3->haveJobs).super___atomic_base<int>._M_i =
                   (peVar3->haveJobs).super___atomic_base<int>._M_i + 1;
              UNLOCK();
              if (_Var1._M_i < ((tg.workerDeque)->ownerData).numWorkers + -1) {
                HighsSplitDeque::WorkerBunk::publishWork
                          (((tg.workerDeque)->ownerData).workerBunk.
                           super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,tg.workerDeque);
              }
            }
            else {
              HighsSplitDeque::growShared(tg.workerDeque);
            }
          }
          else {
            if ((((tg.workerDeque)->ownerData).splitCopy < 0x2000) &&
               (((tg.workerDeque)->ownerData).allStolenCopy == false)) {
              HighsSplitDeque::growShared(tg.workerDeque);
              uVar9 = (pHVar6->ownerData).head;
            }
            (pHVar6->ownerData).head = uVar9 + 1;
            HighsTask::
            Callable<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/coin-or[P]HiGHS/src/parallel/HighsParallel.h:118:16)>
            ::anon_class_24_4_3f80b2e7_for_functor::operator()(&local_50);
          }
          bVar7 = 0x15 < (uint)N;
          N = end;
        } while (bVar7);
        queryNeighbourhood::anon_class_32_4_8f8caa33::operator()(&local_70,0,end);
        ::highs::parallel::TaskGroup::taskWait(&tg);
        ::highs::parallel::TaskGroup::~TaskGroup(&tg);
      }
      lVar13 = 0x18;
      for (lVar12 = 0;
          uVar5._M_t.
          super___uniq_ptr_impl<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData,_highs::cache_aligned::Deleter<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData[]>_>
          ._M_t.
          super__Tuple_impl<0UL,_HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData_*,_highs::cache_aligned::Deleter<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData[]>_>
          .
          super__Head_base<0UL,_HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData_*,_false>
          ._M_head_impl =
               neighbourhoodData.threadCopies_._M_t.
               super___uniq_ptr_impl<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData,_highs::cache_aligned::Deleter<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData_*,_highs::cache_aligned::Deleter<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData[]>_>
               .
               super__Head_base<0UL,_HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData_*,_false>
               ._M_head_impl, lVar12 < neighbourhoodData.numThreads; lVar12 = lVar12 + 1) {
        if (*(char *)((long)neighbourhoodData.threadCopies_._M_t.
                            super___uniq_ptr_impl<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData,_highs::cache_aligned::Deleter<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData[]>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData_*,_highs::cache_aligned::Deleter<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData[]>_>
                            .
                            super__Head_base<0UL,_HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData_*,_false>
                            ._M_head_impl + -0x18 + lVar13) == '\x01') {
          std::vector<int,std::allocator<int>>::
          insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                    ((vector<int,std::allocator<int>> *)neighbourhoodInds,
                     (const_iterator)
                     (neighbourhoodInds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_finish,
                     (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                     *(int **)((long)neighbourhoodData.threadCopies_._M_t.
                                     super___uniq_ptr_impl<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData,_highs::cache_aligned::Deleter<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData_*,_highs::cache_aligned::Deleter<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData[]>_>
                                     .
                                     super__Head_base<0UL,_HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData_*,_false>
                                     ._M_head_impl + -8 + lVar13),
                     (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                     *(int **)((long)neighbourhoodData.threadCopies_._M_t.
                                     super___uniq_ptr_impl<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData,_highs::cache_aligned::Deleter<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData_*,_highs::cache_aligned::Deleter<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData[]>_>
                                     .
                                     super__Head_base<0UL,_HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData_*,_false>
                                     ._M_head_impl + lVar13));
          *local_38 = *local_38 +
                      *(long *)((long)uVar5._M_t.
                                      super___uniq_ptr_impl<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData,_highs::cache_aligned::Deleter<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData[]>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData_*,_highs::cache_aligned::Deleter<HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData[]>_>
                                      .
                                      super__Head_base<0UL,_HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCliqueTable_cpp:455:59)>::PaddedData_*,_false>
                                      ._M_head_impl + -0x10 + lVar13);
        }
        lVar13 = lVar13 + 0x40;
      }
      pdqsort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
                ((neighbourhoodInds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start,
                 (neighbourhoodInds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish);
      HighsCombinable<ThreadNeighbourhoodQueryData,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/coin-or[P]HiGHS/src/mip/HighsCliqueTable.cpp:455:59)>
      ::~HighsCombinable(&neighbourhoodData);
    }
  }
  return;
}

Assistant:

void HighsCliqueTable::queryNeighbourhood(
    std::vector<HighsInt>& neighbourhoodInds, int64_t& numQueries, CliqueVar v,
    CliqueVar* q, HighsInt N) const {
  neighbourhoodInds.clear();

  if (numCliques(v) == 0) return;

  if (numEntries - sizeTwoCliques.size() * 2 < minEntriesForParallelism) {
    for (HighsInt i = 0; i < N; ++i) {
      if (haveCommonClique(numQueries, v, q[i])) neighbourhoodInds.push_back(i);
    }
  } else {
    auto neighbourhoodData =
        makeHighsCombinable<ThreadNeighbourhoodQueryData>([N]() {
          ThreadNeighbourhoodQueryData d;
          d.neighbourhoodInds.reserve(N);
          d.numQueries = 0;
          return d;
        });
    highs::parallel::for_each(
        0, N,
        [this, &neighbourhoodData, v, q](HighsInt start, HighsInt end) {
          ThreadNeighbourhoodQueryData& d = neighbourhoodData.local();
          for (HighsInt i = start; i < end; ++i) {
            if (haveCommonClique(d.numQueries, v, q[i]))
              d.neighbourhoodInds.push_back(i);
          }
        },
        10);

    neighbourhoodData.combine_each([&](ThreadNeighbourhoodQueryData& d) {
      neighbourhoodInds.insert(neighbourhoodInds.end(),
                               d.neighbourhoodInds.begin(),
                               d.neighbourhoodInds.end());
      numQueries += d.numQueries;
    });
    pdqsort(neighbourhoodInds.begin(), neighbourhoodInds.end());
  }
}